

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall
QSplitterPrivate::getRange
          (QSplitterPrivate *this,int index,int *farMin,int *min,int *max,int *farMax)

{
  QWidget *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QRect QVar8;
  int maxAfter;
  int maxBefore;
  int minAfter;
  int minBefore;
  int collapsibleSizeAfter;
  int collapsibleSizeBefore;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (int)(this->list).d.size;
  if (index < iVar5 && 0 < index) {
    this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    iVar6 = 0;
    local_3c = 0;
    iVar2 = findWidgetJustBeforeOrJustAfter(this,index,-1,&local_3c);
    local_40 = 0;
    iVar3 = findWidgetJustBeforeOrJustAfter(this,index,1,&local_40);
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    local_50 = 0;
    do {
      addContribution(this,iVar6,&local_44,&local_4c,iVar2 == iVar6);
      iVar6 = iVar6 + 1;
    } while (index != iVar6);
    if (index < iVar5) {
      do {
        addContribution(this,index,&local_48,&local_50,iVar3 == index);
        index = index + 1;
      } while (iVar5 != index);
    }
    QVar8 = QWidget::contentsRect(this_00);
    bVar7 = this->orient == Horizontal;
    iVar5 = QVar8.y2.m_i.m_i - QVar8.y1.m_i;
    if (bVar7) {
      iVar5 = QVar8.x2.m_i.m_i - QVar8.x1.m_i;
    }
    iVar5 = iVar5 + 1;
    RVar4.m_i = QVar8.y1.m_i.m_i;
    if (bVar7) {
      RVar4.m_i = QVar8.x1.m_i.m_i;
    }
    iVar3 = iVar5 - local_50;
    iVar2 = iVar3;
    if (iVar3 < local_44) {
      iVar2 = local_44;
    }
    iVar6 = iVar5 - local_48;
    if (local_4c < iVar5 - local_48) {
      iVar6 = local_4c;
    }
    iVar1 = local_40;
    if (local_4c < (local_40 - local_48) + iVar5) {
      iVar1 = 0;
    }
    if (farMin != (int *)0x0) {
      iVar5 = 0;
      if (iVar3 <= local_44 - local_3c) {
        iVar5 = local_3c;
      }
      *farMin = (iVar2 + RVar4.m_i) - iVar5;
    }
    if (min != (int *)0x0) {
      *min = iVar2 + RVar4.m_i;
    }
    if (max != (int *)0x0) {
      *max = iVar6 + RVar4.m_i;
    }
    if (farMax != (int *)0x0) {
      *farMax = iVar1 + iVar6 + RVar4.m_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterPrivate::getRange(int index, int *farMin, int *min, int *max, int *farMax) const
{
    Q_Q(const QSplitter);
    int n = list.size();
    if (index <= 0 || index >= n)
        return;

    int collapsibleSizeBefore = 0;
    int idJustBefore = findWidgetJustBeforeOrJustAfter(index, -1, collapsibleSizeBefore);

    int collapsibleSizeAfter = 0;
    int idJustAfter = findWidgetJustBeforeOrJustAfter(index, +1, collapsibleSizeAfter);

    int minBefore = 0;
    int minAfter = 0;
    int maxBefore = 0;
    int maxAfter = 0;
    int i;

    for (i = 0; i < index; ++i)
        addContribution(i, &minBefore, &maxBefore, i == idJustBefore);
    for (i = index; i < n; ++i)
        addContribution(i, &minAfter, &maxAfter, i == idJustAfter);

    QRect r = q->contentsRect();
    int farMinVal;
    int minVal;
    int maxVal;
    int farMaxVal;

    int smartMinBefore = qMax(minBefore, pick(r.size()) - maxAfter);
    int smartMaxBefore = qMin(maxBefore, pick(r.size()) - minAfter);

    minVal = pick(r.topLeft()) + smartMinBefore;
    maxVal = pick(r.topLeft()) + smartMaxBefore;

    farMinVal = minVal;
    if (minBefore - collapsibleSizeBefore >= pick(r.size()) - maxAfter)
        farMinVal -= collapsibleSizeBefore;
    farMaxVal = maxVal;
    if (pick(r.size()) - (minAfter - collapsibleSizeAfter) <= maxBefore)
        farMaxVal += collapsibleSizeAfter;

    if (farMin)
        *farMin = farMinVal;
    if (min)
        *min = minVal;
    if (max)
        *max = maxVal;
    if (farMax)
        *farMax = farMaxVal;
}